

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O1

void Mio_LibrarySortGates(Mio_Library_t *pLib)

{
  int iVar1;
  Mio_Gate_t **__base;
  Mio_Gate_t *pMVar2;
  Mio_Gate_t **ppMVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  size_t __nmemb;
  
  __base = (Mio_Gate_t **)malloc((long)pLib->nGates << 3);
  pMVar2 = Mio_LibraryReadGates(pLib);
  lVar6 = 0;
  for (; pMVar2 != (Mio_Gate_t *)0x0; pMVar2 = Mio_GateReadNext(pMVar2)) {
    pMVar2->Cell = (int)lVar6;
    __base[lVar6] = pMVar2;
    lVar6 = lVar6 + 1;
  }
  iVar1 = pLib->nGates;
  __nmemb = (size_t)iVar1;
  if ((int)lVar6 == iVar1) {
    ppMVar3 = (Mio_Gate_t **)malloc(__nmemb * 8);
    pLib->ppGates0 = ppMVar3;
    if (0 < iVar1) {
      sVar4 = 0;
      do {
        pLib->ppGates0[sVar4] = __base[sVar4];
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
    }
    qsort(__base,__nmemb,8,Mio_LibraryCompareGatesByName);
    lVar6 = (long)pLib->nGates;
    if (0 < lVar6) {
      lVar5 = 0;
      do {
        if (lVar5 < lVar6 + -1) {
          pMVar2 = __base[lVar5 + 1];
        }
        else {
          pMVar2 = (Mio_Gate_t *)0x0;
        }
        __base[lVar5]->pNext = pMVar2;
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
    }
    pLib->pGates = *__base;
    pLib->ppGatesName = __base;
    return;
  }
  __assert_fail("i == pLib->nGates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioRead.c"
                ,0x251,"void Mio_LibrarySortGates(Mio_Library_t *)");
}

Assistant:

void Mio_LibrarySortGates( Mio_Library_t * pLib )
{
    Mio_Gate_t ** ppGates, * pGate;
    int i = 0;
    ppGates = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        pGate->Cell = i;
        ppGates[i++] = pGate;
    }
    assert( i == pLib->nGates );
    // sort gates by name
    pLib->ppGates0 = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    for ( i = 0; i < pLib->nGates; i++ )
        pLib->ppGates0[i] = ppGates[i];
    qsort( (void *)ppGates, (size_t)pLib->nGates, sizeof(void *), 
            (int (*)(const void *, const void *)) Mio_LibraryCompareGatesByName );
    for ( i = 0; i < pLib->nGates; i++ )
        ppGates[i]->pNext = (i < pLib->nGates-1)? ppGates[i+1] : NULL;
    pLib->pGates = ppGates[0];
    pLib->ppGatesName = ppGates;
}